

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

char * ssh2_pubkey_openssh_str(ssh2_userkey *key)

{
  strbuf *buf_o;
  char *pcVar1;
  
  buf_o = strbuf_new();
  (*key->key->vt->public_blob)(key->key,buf_o->binarysink_);
  pcVar1 = ssh2_pubkey_openssh_str_internal(key->comment,buf_o->s,(int)buf_o->len);
  strbuf_free(buf_o);
  return pcVar1;
}

Assistant:

char *ssh2_pubkey_openssh_str(ssh2_userkey *key)
{
    strbuf *blob;
    char *ret;

    blob = strbuf_new();
    ssh_key_public_blob(key->key, BinarySink_UPCAST(blob));
    ret = ssh2_pubkey_openssh_str_internal(
        key->comment, blob->s, blob->len);
    strbuf_free(blob);

    return ret;
}